

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O2

void generate_convert_field
               (dill_stream c,ConvStatus conv_status,dill_reg src_addr,size_t src_offset,
               dill_reg dest_addr,size_t dest_offset,dill_reg rt_conv_status,IOconvFieldStruct *conv
               ,FMTypeDesc *type_desc,int data_already_copied)

{
  short sVar1;
  short sVar2;
  FMdata_type FVar3;
  row_column_swap_type rVar4;
  undefined8 uVar5;
  int *piVar6;
  jmp_data *pjVar7;
  _FMgetFieldStruct src;
  _FMgetFieldStruct tmp_spec_00;
  _FMgetFieldStruct src_00;
  iogen_oprnd src_oprnd;
  iogen_oprnd oprnd;
  iogen_oprnd src_oprnd_00;
  iogen_oprnd oprnd_00;
  iogen_oprnd src_01;
  iogen_oprnd oprnd_01;
  undefined1 auVar8 [24];
  uint uVar9;
  uint type;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  dill_reg dVar15;
  FMTypeEnum FVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  char *pcVar24;
  ssize_t sVar25;
  jmp_table pjVar26;
  dill_stream s;
  conv_routine p_Var27;
  FMTypeDesc *pFVar28;
  arith_op3i *pp_Var29;
  dill_reg new_src;
  long lVar30;
  ulong uVar31;
  size_t dest_offset_00;
  dill_reg new_dest;
  int in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffeec;
  dill_reg *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  byte local_f0;
  _FMgetFieldStruct tmp_spec;
  int iStack_b0;
  int iStack_ac;
  dill_reg local_a8;
  dill_reg dStack_a4;
  _FMgetFieldStruct local_88;
  dill_reg actual_dest_reg;
  int local_68;
  FMdata_type local_64;
  dill_reg actual_src_reg;
  FMdata_type FStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  size_t local_48;
  int iStack_40;
  int iStack_3c;
  dill_reg local_38;
  dill_reg dStack_34;
  
  switch(type_desc->type) {
  case FMType_pointer:
    tmp_spec.byte_swap = (conv->src_field).byte_swap;
    tmp_spec.src_float_format = (conv->src_field).src_float_format;
    tmp_spec.target_float_format = (conv->src_field).target_float_format;
    tmp_spec._19_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    tmp_spec.offset = (conv->src_field).offset;
    tmp_spec.size = (conv->src_field).size;
    tmp_spec.data_type = (conv->src_field).data_type;
    iVar23 = dill_alloc_label(c,0);
    tmp_spec.offset = 0;
    tmp_spec.size = conv_status->src_pointer_size;
    auVar8._4_4_ = tmp_spec.data_type;
    auVar8._0_4_ = conv_status->src_pointer_size;
    auVar8._8_4_ = tmp_spec._16_4_;
    auVar8._12_4_ = tmp_spec._20_4_;
    auVar8._16_8_ = 0;
    gen_convert_address_field
              (c,(_FMgetFieldStruct)(auVar8 << 0x40),src_addr,(dill_reg)src_offset,
               (long)conv_status->target_pointer_size,conv_status->src_offset_adjust,rt_conv_status,
               (size_t)&actual_src_reg,(size_t)&actual_dest_reg,conv_status->register_args,
               CONCAT44(in_stack_fffffffffffffeec,iVar23),in_stack_fffffffffffffef0,
               (dill_reg *)CONCAT44(in_stack_fffffffffffffefc,src_addr),iVar23,(int)dest_offset);
    iVar11 = dill_getreg(c,8);
    dVar15 = dill_getreg(c,8);
    (*c->j->mov)(c,8,0,dVar15,actual_src_reg);
    (*c->j->mov)(c,8,0,iVar11,actual_dest_reg);
    generate_convert_field
              (c,conv_status,dVar15,0,iVar11,0,rt_conv_status,conv,type_desc->next,
               (uint)(conv_status->global_conv->conversion_type == direct_to_mem));
    dill_mark_label(c,iVar23);
    pjVar26 = c->j;
    iVar11 = 8;
    break;
  case FMType_array:
    rVar4 = conv->rc_swap;
    if (rVar4 != no_row_column_swap) {
      tmp_spec.byte_swap = (conv->src_field).byte_swap;
      tmp_spec.src_float_format = (conv->src_field).src_float_format;
      tmp_spec.target_float_format = (conv->src_field).target_float_format;
      tmp_spec._19_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
      tmp_spec.offset = (conv->src_field).offset;
      tmp_spec.size = (conv->src_field).size;
      tmp_spec.data_type = (conv->src_field).data_type;
      iVar23 = conv->iovar->dimen_count;
      FVar3 = (conv->src_field).data_type;
      iVar11 = dill_getreg(c,8);
      iVar12 = dill_getreg(c,4);
      iVar13 = dill_getreg(c,8);
      uVar10 = dill_getvblock(c);
      uVar14 = dill_getvblock(c,0x18);
      dill_virtual_lea(c,iVar11,uVar10);
      dill_virtual_lea(c,iVar13,uVar14);
      lVar30 = 0;
      for (; type_desc->type == FMType_array; type_desc = type_desc->next) {
        if ((long)type_desc->static_size == 0) {
          (*c->j->loadi)(c,4,0,iVar12,*(int *)&conv_status->control_value,
                         (long)type_desc->control_field_index << 2);
        }
        else {
          (*c->j->set)(c,4,0,iVar12,(long)type_desc->static_size);
        }
        (*c->j->storei)(c,4,0,iVar12,iVar11,lVar30);
        lVar30 = lVar30 + 4;
      }
      (*c->j->set)(c,4,0,iVar12,0);
      (*c->j->storei)(c,4,0,iVar12,iVar11,(long)iVar23 << 2);
      (*c->j->storei)(c,4,0,iVar12,iVar13,0);
      for (uVar31 = 4; uVar31 < 0x18; uVar31 = uVar31 + 4) {
        (*c->j->set)(c,4,0,iVar12,(long)*(int *)((long)&tmp_spec.offset + uVar31));
        (*c->j->storei)(c,4,0,iVar12,iVar13,uVar31);
      }
      iVar23 = dill_getreg(c,8);
      iVar12 = dill_getreg(c,8);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar23,src_addr,src_offset);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar12,dest_addr,dest_offset);
      dill_scallv(c,transpose_array,"transpose_array","%p%p%p%I%I%I%p",iVar11,iVar23,iVar12,
                  rVar4 == swap_source_column_major,FVar3,conv->dest_size,iVar13);
      return;
    }
    iVar23 = (conv->src_field).size;
    iVar11 = 1;
    FVar16 = FMType_array;
    pFVar28 = type_desc;
    while (FVar16 == FMType_array) {
      iVar11 = iVar11 * (pFVar28->static_size + (uint)(pFVar28->static_size == 0));
      pFVar28 = pFVar28->next;
      FVar16 = pFVar28->type;
    }
    if (((((data_already_copied != 0) && ((conv->src_field).byte_swap == '\0')) &&
         ((conv->src_field).src_float_format == (conv->src_field).target_float_format)) &&
        ((iVar23 == conv->dest_size && (conv->subconversion == (IOConversionPtr)0x0)))) &&
       (((FVar16 & ~FMType_string) != FMType_pointer && ((conv->src_field).data_type != string_type)
        ))) {
      return;
    }
    iVar13 = dill_getreg(c,8);
    iVar17 = dill_getreg(c,8);
    (*c->j->mov)(c,8,0,iVar13,src_addr);
    (*c->j->mov)(c,8,0,iVar17,dest_addr);
    iVar12 = dill_getreg(c,4);
    pjVar7 = c->j->a3i_data;
    (*c->j->jmp_a3i[0x28])
              (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar13,iVar13,src_offset);
    pjVar7 = c->j->a3i_data;
    (*c->j->jmp_a3i[0x28])
              (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar17,iVar17,dest_offset);
    iVar18 = dill_alloc_label(c,0);
    iVar19 = dill_alloc_label(c,0);
    (*c->j->set)(c,4,0,iVar12,(long)iVar11);
    iVar11 = iVar12;
    for (; type_desc->type == FMType_array; type_desc = type_desc->next) {
      iVar21 = iVar11;
      if (type_desc->static_size == 0) {
        iVar12 = *(int *)&conv_status->control_value;
        iVar22 = type_desc->control_field_index;
        iVar20 = dill_getreg(c,4);
        iVar21 = iVar11;
        (*c->j->loadi)(c,4,0,iVar20,iVar12,(long)iVar22 << 2);
        pjVar7 = c->j->a3_data;
        (*c->j->jmp_a3[8])(c,(int)pjVar7[8].data1,(int)pjVar7[8].data2,iVar11,iVar11,iVar20);
        iVar12 = iVar11;
      }
      iVar11 = iVar21;
    }
    if (data_already_copied == 0) {
      sVar25 = decode_size_delta(conv_status,conv,type_desc);
      if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
        iVar21 = item_size(conv_status,conv,type_desc);
        iVar22 = dill_getreg(c,4);
        pjVar7 = c->j->a3i_data;
        (*c->j->jmp_a3i[8])(c,(int)pjVar7[8].data1,(int)pjVar7[8].data2,iVar22,iVar12,(long)iVar21);
        dill_scallv(c,memcpy,"memcpy","%p%p%i",iVar17,iVar13,iVar22);
      }
      if (sVar25 != 0) {
        iVar12 = dill_getreg(c,4);
        iVar21 = dill_getreg(c,4);
        pjVar7 = c->j->a3i_data;
        (*c->j->jmp_a3i[8])(c,(int)pjVar7[8].data1,(int)pjVar7[8].data2,iVar12,iVar11,sVar25);
        (*c->j->loadi)(c,8,0,iVar21,rt_conv_status,8);
        pjVar7 = c->j->a3_data;
        (*c->j->jmp_a3[0x28])
                  (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar21,iVar21,iVar12);
        (*c->j->storei)(c,8,0,iVar21,rt_conv_status,8);
        iVar12 = iVar11;
      }
    }
    if (_debug_code_generation != 0) {
      dill_scallv(c,printf,"printf","%P%P%p","format %s, field Initial loopvar = %x\n",
                  conv_status->global_conv->ioformat->body->format_name,iVar12);
    }
    pjVar7 = c->j->b_data;
    (*c->j->jmp_bi[0x25])(c,(int)pjVar7[0x25].data1,(int)pjVar7[0x25].data2,iVar12,0,iVar19);
    dill_mark_label(c,iVar18);
    generate_convert_field
              (c,conv_status,iVar13,0,iVar17,0,rt_conv_status,conv,type_desc,data_already_copied);
    pjVar7 = c->j->a3i_data;
    (*c->j->jmp_a3i[4])(c,(int)pjVar7[4].data1,(int)pjVar7[4].data2,iVar12,iVar12,1);
    if (((conv->iovar->type_desc).type == FMType_pointer) &&
       (((conv->iovar->type_desc).next)->next->type == FMType_pointer)) {
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar13,iVar13,
                 (long)conv_status->src_pointer_size);
      pp_Var29 = c->j->jmp_a3i;
      pjVar7 = c->j->a3i_data;
      sVar1 = pjVar7[0x28].data1;
      sVar2 = pjVar7[0x28].data2;
      iVar23 = conv_status->target_pointer_size;
    }
    else {
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar13,iVar13,(long)iVar23);
      pp_Var29 = c->j->jmp_a3i;
      pjVar7 = c->j->a3i_data;
      sVar1 = pjVar7[0x28].data1;
      sVar2 = pjVar7[0x28].data2;
      iVar23 = conv->dest_size;
    }
    (*pp_Var29[0x28])(c,(int)sVar1,(int)sVar2,iVar17,iVar17,(long)iVar23);
    if (_debug_code_generation != 0) {
      dill_scallv(c,printf,"printf","%P%p%p%p","loopvar = %x, src %x, dest %x\n",iVar12,iVar13,
                  iVar17);
    }
    pjVar7 = c->j->b_data;
    (*c->j->jmp_bi[0x1a])(c,(int)pjVar7[0x1a].data1,(int)pjVar7[0x1a].data2,iVar12,0,iVar18);
    dill_mark_label(c,iVar19);
    return;
  case FMType_string:
    tmp_spec.size = (conv->src_field).size;
    tmp_spec.data_type = (conv->src_field).data_type;
    tmp_spec.byte_swap = (conv->src_field).byte_swap;
    tmp_spec.src_float_format = (conv->src_field).src_float_format;
    tmp_spec.target_float_format = (conv->src_field).target_float_format;
    tmp_spec._19_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    tmp_spec.offset = 0;
    uVar10 = dill_alloc_label(c,0);
    uVar14 = tmp_spec._16_4_;
    tmp_spec_00.size = tmp_spec.size;
    tmp_spec_00.offset = tmp_spec.offset;
    tmp_spec_00.data_type = tmp_spec.data_type;
    tmp_spec_00.byte_swap = (char)uVar14;
    tmp_spec_00.src_float_format = (char)((uint)uVar14 >> 8);
    tmp_spec_00.target_float_format = (char)((uint)uVar14 >> 0x10);
    tmp_spec_00._19_1_ = (char)((uint)uVar14 >> 0x18);
    tmp_spec_00._20_4_ = tmp_spec._20_4_;
    gen_convert_address_field
              (c,tmp_spec_00,src_addr,(dill_reg)src_offset,(long)conv->dest_size,
               conv_status->src_offset_adjust,rt_conv_status,(size_t)&actual_src_reg,
               (size_t)&actual_dest_reg,conv_status->register_args,
               CONCAT44(in_stack_fffffffffffffeec,uVar10),in_stack_fffffffffffffef0,
               (dill_reg *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               data_already_copied,(int)dest_offset);
    if (data_already_copied == 0) {
      dill_scallv(c,strcpy,"strcpy","%p%p",actual_dest_reg,actual_src_reg);
    }
    dill_mark_label(c,uVar10);
    pjVar26 = c->j;
    iVar11 = 8;
    break;
  case FMType_subformat:
    pcVar24 = FFSTypeHandle_name(conv->subconversion->ioformat);
    if (conv->subconversion->conv_func == (conv_routine)0x0) {
      conv_status->global_conv->conv_pkg = (char *)0xffffffffffffffff;
    }
    iVar23 = conv_status->register_args;
    iVar11 = dill_getreg(c,8);
    iVar12 = dill_getreg(c,8);
    if (iVar23 == 0) {
      dVar15 = dill_getreg(c,8);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar11,src_addr,src_offset);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar12,dest_addr,dest_offset);
      (*c->j->loadi)(c,8,0,dVar15,c->dill_local_pointer,(long)rt_conv_status);
      p_Var27 = conv->subconversion->conv_func;
    }
    else {
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar11,src_addr,src_offset);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar12,dest_addr,dest_offset);
      p_Var27 = conv->subconversion->conv_func;
      dVar15 = rt_conv_status;
    }
    dill_scallp(c,p_Var27,pcVar24,"%p%p%p",iVar11,iVar12,dVar15);
    return;
  case FMType_simple:
    iVar23 = (conv->src_field).size;
    FVar3 = (conv->src_field).data_type;
    uVar5._0_1_ = (conv->src_field).byte_swap;
    uVar5._1_1_ = (conv->src_field).src_float_format;
    uVar5._2_1_ = (conv->src_field).target_float_format;
    uVar5._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    iVar11 = conv_status->global_conv->required_alignment;
    iVar12 = conv->dest_size;
    local_88.offset = 0;
    local_88.size = iVar23;
    local_88.data_type = FVar3;
    local_88._16_8_ = uVar5;
    local_68 = iVar12;
    local_64 = FVar3;
    uVar9 = drisc_type(&local_88);
    type = drisc_type((_FMgetFieldStruct *)&actual_dest_reg);
    piVar6 = c->j->type_align;
    iVar13 = piVar6[uVar9];
    iVar17 = piVar6[type];
    if ((iVar11 < iVar13) || (src_offset % (ulong)(long)iVar13 != 0)) {
      iVar13 = 0;
    }
    else {
      iVar13 = 1;
    }
    if ((iVar11 < iVar17) || (dest_offset % (ulong)(long)iVar17 != 0)) {
      iVar17 = 0;
    }
    else {
      iVar17 = 1;
    }
    if (FVar3 != float_type) {
      gen_operand((iogen_oprnd *)&tmp_spec,src_addr,src_offset,iVar23,FVar3,iVar13,
                  (uint)(uchar)uVar5);
      if ((int)tmp_spec.offset != 0) {
        gen_load(c,(iogen_oprnd_ptr)&tmp_spec);
      }
      if (tmp_spec.offset._4_4_ != FVar3) {
        src_oprnd.size = tmp_spec.size;
        src_oprnd.address = (int)tmp_spec.offset;
        src_oprnd.data_type = tmp_spec.offset._4_4_;
        src_oprnd._12_4_ = tmp_spec.data_type;
        src_oprnd.offset._0_4_ = tmp_spec._16_4_;
        src_oprnd.offset._4_4_ = tmp_spec._20_4_;
        src_oprnd.aligned = (int)_iStack_b0;
        src_oprnd.byte_swap = SUB84(_iStack_b0,4);
        src_oprnd.vc_reg = (dill_reg)_local_a8;
        src_oprnd.vc_reg2 = SUB84(_local_a8,4);
        gen_type_conversion((iogen_oprnd *)&actual_src_reg,c,src_oprnd,FVar3);
        oprnd.size = tmp_spec.size;
        oprnd.address = (int)tmp_spec.offset;
        oprnd.data_type = tmp_spec.offset._4_4_;
        oprnd._12_4_ = tmp_spec.data_type;
        oprnd.offset._0_4_ = tmp_spec._16_4_;
        oprnd.offset._4_4_ = tmp_spec._20_4_;
        oprnd.aligned = (int)_iStack_b0;
        oprnd.byte_swap = SUB84(_iStack_b0,4);
        oprnd.vc_reg = (dill_reg)_local_a8;
        oprnd.vc_reg2 = SUB84(_local_a8,4);
        free_oprnd(c,oprnd);
        local_a8 = local_38;
        dStack_a4 = dStack_34;
        tmp_spec.offset = CONCAT44(FStack_54,actual_src_reg);
        tmp_spec.byte_swap = (undefined1)local_48;
        tmp_spec.src_float_format = local_48._1_1_;
        tmp_spec.target_float_format = local_48._2_1_;
        tmp_spec._19_5_ = local_48._3_5_;
        iStack_b0 = iStack_40;
        iStack_ac = iStack_3c;
        tmp_spec.size = iStack_50;
        tmp_spec.data_type = uStack_4c;
      }
      if (tmp_spec.size != iVar12) {
        src_oprnd_00.size = tmp_spec.size;
        src_oprnd_00.address = (int)tmp_spec.offset;
        src_oprnd_00.data_type = tmp_spec.offset._4_4_;
        src_oprnd_00._12_4_ = tmp_spec.data_type;
        src_oprnd_00.offset._0_4_ = tmp_spec._16_4_;
        src_oprnd_00.offset._4_4_ = tmp_spec._20_4_;
        src_oprnd_00.aligned = (int)_iStack_b0;
        src_oprnd_00.byte_swap = SUB84(_iStack_b0,4);
        src_oprnd_00.vc_reg = (dill_reg)_local_a8;
        src_oprnd_00.vc_reg2 = SUB84(_local_a8,4);
        gen_size_conversion((iogen_oprnd *)&actual_src_reg,c,src_oprnd_00,iVar12);
        oprnd_00.size = tmp_spec.size;
        oprnd_00.address = (int)tmp_spec.offset;
        oprnd_00.data_type = tmp_spec.offset._4_4_;
        oprnd_00._12_4_ = tmp_spec.data_type;
        oprnd_00.offset._0_4_ = tmp_spec._16_4_;
        oprnd_00.offset._4_4_ = tmp_spec._20_4_;
        oprnd_00.aligned = (int)_iStack_b0;
        oprnd_00.byte_swap = SUB84(_iStack_b0,4);
        oprnd_00.vc_reg = (dill_reg)_local_a8;
        oprnd_00.vc_reg2 = SUB84(_local_a8,4);
        free_oprnd(c,oprnd_00);
        local_a8 = local_38;
        dStack_a4 = dStack_34;
        tmp_spec.offset = CONCAT44(FStack_54,actual_src_reg);
        tmp_spec.byte_swap = (undefined1)local_48;
        tmp_spec.src_float_format = local_48._1_1_;
        tmp_spec.target_float_format = local_48._2_1_;
        tmp_spec._19_5_ = local_48._3_5_;
        iStack_b0 = iStack_40;
        iStack_ac = iStack_3c;
        tmp_spec.size = iStack_50;
        tmp_spec.data_type = uStack_4c;
      }
      src_01.size = tmp_spec.size;
      src_01.address = (int)tmp_spec.offset;
      src_01.data_type = tmp_spec.offset._4_4_;
      src_01._12_4_ = tmp_spec.data_type;
      src_01.offset._0_4_ = tmp_spec._16_4_;
      src_01.offset._4_4_ = tmp_spec._20_4_;
      src_01.aligned = (int)_iStack_b0;
      src_01.byte_swap = SUB84(_iStack_b0,4);
      src_01.vc_reg = (dill_reg)_local_a8;
      src_01.vc_reg2 = SUB84(_local_a8,4);
      gen_store(c,src_01,dest_addr,dest_offset,iVar12,FVar3,iVar17);
      oprnd_01.size = tmp_spec.size;
      oprnd_01.address = (int)tmp_spec.offset;
      oprnd_01.data_type = tmp_spec.offset._4_4_;
      oprnd_01._12_4_ = tmp_spec.data_type;
      oprnd_01.offset._0_4_ = tmp_spec._16_4_;
      oprnd_01.offset._4_4_ = tmp_spec._20_4_;
      oprnd_01.aligned = (int)_iStack_b0;
      oprnd_01.byte_swap = SUB84(_iStack_b0,4);
      oprnd_01.vc_reg = (dill_reg)_local_a8;
      oprnd_01.vc_reg2 = SUB84(_local_a8,4);
      free_oprnd(c,oprnd_01);
      return;
    }
    if (iVar23 == iVar12) {
      uVar10 = local_88._16_4_;
      src.size = local_88.size;
      src.offset = local_88.offset;
      src.data_type = local_88.data_type;
      src.byte_swap = (char)uVar10;
      src.src_float_format = (char)((uint)uVar10 >> 8);
      src.target_float_format = (char)((uint)uVar10 >> 0x10);
      src._19_1_ = (char)((uint)uVar10 >> 0x18);
      src._20_4_ = local_88._20_4_;
      gen_mem_float_conv(c,src,src_addr,src_offset,iVar11,dest_addr,dest_offset,iVar23,
                         in_stack_fffffffffffffed8);
      return;
    }
    if (uVar9 == 4 || type == 4) {
      puts("must do call to conversion subroutine");
      return;
    }
    iVar23 = ffs_local(c,type);
    dest_offset_00 = (size_t)iVar23;
    uVar10 = local_88._16_4_;
    src_00.size = local_88.size;
    src_00.offset = local_88.offset;
    src_00.data_type = local_88.data_type;
    src_00.byte_swap = (char)uVar10;
    src_00.src_float_format = (char)((uint)uVar10 >> 8);
    src_00.target_float_format = (char)((uint)uVar10 >> 0x10);
    src_00._19_1_ = (char)((uint)uVar10 >> 0x18);
    src_00._20_4_ = local_88._20_4_;
    gen_mem_float_conv(c,src_00,src_addr,src_offset,iVar11,c->dill_local_pointer,dest_offset_00,
                       iVar12,in_stack_fffffffffffffed8);
    iVar23 = dill_getreg(c,10);
    if (type == 9) {
      iVar12 = 9;
      (*c->j->loadi)(c,9,0,iVar23,c->dill_local_pointer,dest_offset_00);
      pjVar26 = c->j;
      iVar11 = 10;
    }
    else {
      if (type != 10) {
        return;
      }
      iVar12 = 10;
      (*c->j->loadi)(c,10,0,iVar23,c->dill_local_pointer,dest_offset_00);
      pjVar26 = c->j;
      iVar11 = 9;
    }
    (*pjVar26->convert)(c,iVar12,iVar11,iVar23,iVar23);
    pjVar26 = c->j;
    actual_dest_reg = iVar23;
    break;
  default:
    goto switchD_0011132f_default;
  }
  (*pjVar26->storei)(c,iVar11,0,actual_dest_reg,dest_addr,dest_offset);
switchD_0011132f_default:
  return;
}

Assistant:

static void
generate_convert_field(dill_stream c, ConvStatus conv_status, dill_reg src_addr,
		       size_t src_offset, dill_reg dest_addr, size_t dest_offset,
		       dill_reg rt_conv_status, IOconvFieldStruct *conv, FMTypeDesc *type_desc,
		       int data_already_copied)
{
    switch(type_desc->type) {
    case FMType_pointer: {
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	int null_target = dill_alloc_label(c, NULL);
	tmp_spec.offset = 0;
	tmp_spec.size = conv_status->src_pointer_size;
	
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv_status->target_pointer_size, 
				  dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	{
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    dill_reg tmp_src_reg, tmp_dest_reg;
	    ffs_getreg(c, &tmp_dest_reg, DILL_P, DILL_VAR);
	    ffs_getreg(c, &tmp_src_reg, DILL_P, DILL_VAR);
#endif
	    dill_movp(c, tmp_src_reg, actual_src_reg);
	    dill_movp(c, tmp_dest_reg, actual_dest_reg);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       actual_src_reg, actual_dest_reg));
	    ffs_putreg(c, actual_src_reg, DILL_P);
	    ffs_putreg(c, actual_dest_reg, DILL_P);
	    generate_convert_field(c, conv_status, tmp_src_reg, 0, 
				   tmp_dest_reg, 0, rt_conv_status,
				   conv, type_desc->next, conv_status->global_conv->conversion_type == direct_to_mem);
	    
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	dill_mark_label(c, null_target);
	
#ifdef VERBOSE
	dill_scallv(c, (void*)printf, "printf", "%P%p",
		    "storing POINTER value %p\n",actual_dest_reg);
#endif
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);

	break;
    }
    case FMType_string:{
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	int null_target = dill_alloc_label(c, NULL);
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv->dest_size, dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	/* generate strcpy */
	if (!data_already_copied) {
#ifdef VERBOSE
	    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
			"Calling Strcpy with args %p, %p\n",actual_dest_reg, actual_src_reg);

#endif
	    dill_scallv(c, (void*)strcpy, "strcpy", "%p%p", actual_dest_reg, actual_src_reg);

	}
	dill_mark_label(c, null_target);
	
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);
	REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		   actual_src_reg, actual_dest_reg));
	ffs_putreg(c, actual_src_reg, DILL_P);
	ffs_putreg(c, actual_dest_reg, DILL_P);
	break;
    }
    case FMType_subformat: {
	FFSTypeHandle subformat = conv->subconversion->ioformat;
	char *name = FFSTypeHandle_name(subformat);
	if (conv->subconversion->conv_func == NULL) {
	    /* we're not linking to an address that's valid, 
	       must fill it in later */
	    conv_status->global_conv->conv_pkg = (char *) -1;
	}
	    
	if (conv_status->register_args) {
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    (void) dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			      new_dest, rt_conv_status);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    if (debug_code_generation()) {
/*	        VCALL2V(printf, "%P%p",
	    "After subroutine call, new src_string_base is %p\n", src_string_base);*/
	    }
	    ffs_putreg(c, new_src, DILL_P);
	    ffs_putreg(c, new_dest, DILL_P);
	} else {
	    dill_reg reg_rt_conv_status;
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#endif

	    if (!ffs_getreg(c, &reg_rt_conv_status, DILL_P, DILL_TEMP))
		gen_fatal("temp string vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for reg_rt_conv_status\n", reg_rt_conv_status));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    dill_ldpi(c, reg_rt_conv_status, dill_lp(c), rt_conv_status);
	    dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			new_dest, reg_rt_conv_status);
	    REG_DEBUG(("Putting %d reg_rt_conv_status\n", reg_rt_conv_status));
	    ffs_putreg(c, reg_rt_conv_status, DILL_P);
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	break;
    }
    case FMType_simple: {
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	gen_simple_field_conv(c, tmp_spec, 
			      conv_status->global_conv->required_alignment, 
			      src_addr, src_offset, 
			      conv->dest_size, tmp_spec.data_type, 
			      dest_addr, dest_offset);
	break;
    }
    case FMType_array:
	if (conv->rc_swap == no_row_column_swap) {
	    int static_elements = 1;
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    FMTypeDesc *next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    static_elements *= next->static_size;
		}
		next = next->next;
	    }
	
	    dill_reg loop_var;
	    int loop_var_type;

	    int loop_head, loop_end;
	    if (data_already_copied &&
		!conv->src_field.byte_swap &&
		(conv->src_field.src_float_format == conv->src_field.target_float_format) &&
		(conv->src_field.size == conv->dest_size) &&
		(conv->subconversion == NULL) &&
		(next->type != FMType_pointer) &&
		(next->type != FMType_string) &&
		((conv->src_field.data_type != string_type))) {
		/* Nothing but data movement required */
		    break;
	    }
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    int loop_storage = 0;

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_movp(c, tmp_src, src_addr);
		dill_movp(c, tmp_dest, dest_addr);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
#endif

	    if (((conv->subconversion == NULL)) &&
		!debug_code_generation()) {
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_TEMP))
		    gen_fatal("gen field convert out of registers BB \n");
		loop_var_type = DILL_TEMP;
	    } else {
		/* may call a subconversion in here, use VARs */
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_VAR))
		    gen_fatal("gen field convert out of registers CC\n");
		loop_var_type = DILL_VAR;
	    }
	    REG_DEBUG(("Getting1 %d as loop_var\n", _vrr(loop_var)));
	    dill_addpi(c, src_addr, src_addr, src_offset);
	    dill_addpi(c, dest_addr, dest_addr, dest_offset);

	    /* gen conversion loop */
	    loop_head = dill_alloc_label(c, NULL);
	    loop_end = dill_alloc_label(c, NULL);
	    dill_seti(c, loop_var, static_elements);
	    next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size == 0) {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    dill_reg val;
		    int field = next->control_field_index;
		    ffs_getreg(c, &val, DILL_I, DILL_TEMP);
		    dill_ldii(c, val, addr_reg, field*sizeof(int));
		    dill_muli(c, loop_var, loop_var, val);
		}
		next = next->next;
	    }
	    if (!data_already_copied) {
		ssize_t base_delta = decode_size_delta(conv_status, conv, next);
		if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
		    int base_size = item_size(conv_status, conv, next);
		    dill_reg size;
		    ffs_getreg(c, &size, DILL_I, DILL_TEMP);
		    dill_mulii(c, size, loop_var, base_size);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
				"Calling Memcpy with args %p, %p, %d\n",dest_addr, src_addr, size);
#endif
		    dill_scallv(c, (void*)memcpy, "memcpy", "%p%p%i",
				dest_addr, src_addr, size);
		}
		if (base_delta != 0) {
		    dill_reg dest_src_ptr, delta;
		    ffs_getreg(c, &delta, DILL_I, DILL_TEMP);
		    ffs_getreg(c, &dest_src_ptr, DILL_I, DILL_TEMP);
		    dill_mulii(c, delta, loop_var, base_delta);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p",
				"Adjusting dest_pointer_base by %p\n", delta);
#endif
		    dill_ldpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		    dill_addp(c, dest_src_ptr, dest_src_ptr, delta);
		    dill_stpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		}
	    }

	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%P%p",
			    "format %s, field Initial loopvar = %x\n", conv_status->global_conv->ioformat->body->format_name, loop_var);
	    }
	    
	    dill_bleii(c, loop_var, 0, loop_end);
	    dill_mark_label(c, loop_head);
#if defined(NOT) & defined(RAW)
	    if (!register_args) {
		/* store away loop var and free the reg */
		loop_storage = ffs_local(c, DILL_I);
		dill_stii(c, loop_var, dill_lp(c), loop_storage);
		REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
		ffs_putreg(c, loop_var, DILL_I);
	    }
#endif
	    generate_convert_field(c, conv_status, src_addr, 0, dest_addr, 0, 
				   rt_conv_status, conv, next, 
				   data_already_copied);
	    
	    (void)loop_var_type;  /* avoid warning */
#if defined(NOT) & defined(RAW)
	    /* generate end of loop */
	    if (!register_args) {
		/* store away loop var and free the reg */
		ffs_getreg(c, &loop_var, DILL_I, loop_var_type);
		REG_DEBUG(("Getting %d as loop_var\n", _vrr(loop_var)));
		dill_ldii(c, loop_var, dill_lp(c), loop_storage);
	    }
#endif
	    dill_subii(c, loop_var, loop_var, 1);
	    int array_of_pointers = 0;
	    if (conv->iovar->type_desc.type == FMType_pointer) {
		array_of_pointers = (conv->iovar->type_desc.next->next->type == FMType_pointer);
	    }
	    if (array_of_pointers) {
		dill_addpi(c, src_addr, src_addr, conv_status->src_pointer_size);
		dill_addpi(c, dest_addr, dest_addr, conv_status->target_pointer_size);
	    } else {
		dill_addpi(c, src_addr, src_addr, tmp_spec.size);
		dill_addpi(c, dest_addr, dest_addr, conv->dest_size);
	    }		
	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%p%p%p",
			    "loopvar = %x, src %x, dest %x\n", loop_var,
			    src_addr, dest_addr);
	    }
	    dill_bgtii(c, loop_var, 0, loop_head);
	    dill_mark_label(c, loop_end);
	    ffs_putreg(c, loop_var, DILL_I);
	    REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
	
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	} else {
	    /* generate a call to transpose */
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    dill_reg dimens, dimen_reg, spec, spec_reg, tmp;
	    int source_column_major = 
		(conv->rc_swap == swap_source_column_major);
	    int dimen_count = conv->iovar->dimen_count;
	    FMdata_type dest_type = conv->src_field.data_type;

	    ffs_getreg(c, &dimen_reg, DILL_P, DILL_TEMP);
	    ffs_getreg(c, &tmp, DILL_I, DILL_TEMP);
	    ffs_getreg(c, &spec_reg, DILL_P, DILL_TEMP);
	    dimens = ffs_localb(c, dimen_count * sizeof(int));
	    spec = ffs_localb(c, sizeof(struct _FMgetFieldStruct));
	    dill_virtual_lea(c, dimen_reg, dimens);
	    dill_virtual_lea(c, spec_reg, spec);
	    FMTypeDesc *next = type_desc;
	    int i = 0;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    dill_seti(c, tmp, next->static_size);
		} else {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    int field = next->control_field_index;
		    dill_ldii(c, tmp, addr_reg, field*sizeof(int));
		}
		dill_stii(c, tmp, dimen_reg, i * sizeof(int));
		i++;
		next = next->next;
	    }
	    dill_seti(c, tmp, 0);
	    dill_stii(c, tmp, dimen_reg, dimen_count * sizeof(int));
	    dill_stii(c, tmp, spec_reg, FMOffset(struct _IOgetFieldStruct *, offset));
	    for (i=4 ; i < sizeof(struct _IOgetFieldStruct); i+= 4) {
		dill_seti(c, tmp, *((int*)((char*)&tmp_spec + i)));
		dill_stii(c, tmp, spec_reg, i);
	    }
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_addpi(c, tmp_src, src_addr, src_offset);
		dill_addpi(c, tmp_dest, dest_addr, dest_offset);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
	    dill_scallv(c, (void*)transpose_array, "transpose_array",
			"%p%p%p%I%I%I%p", dimen_reg, src_addr, dest_addr,
			source_column_major, dest_type, conv->dest_size, spec_reg);
	}
	break;
    }
}